

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall
cppforth::Forth::setSourceVariables(Forth *this,Cell Source,Cell sourceSize,Cell sourceMoreIn)

{
  setSourceAddress(this,Source);
  setSourceBufferSize(this,sourceSize);
  setSourceBufferOffset(this,sourceMoreIn);
  return;
}

Assistant:

void setSourceVariables(Cell Source, Cell sourceSize, Cell sourceMoreIn) {
			setSourceAddress(Source);
			setSourceBufferSize(sourceSize);
			setSourceBufferOffset(sourceMoreIn);
		}